

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O3

Optional<Corrade::Utility::Json> Corrade::Utility::Json::fromFile(StringView filename)

{
  undefined1 auVar1 [16];
  String *string_00;
  Debug *this;
  size_t in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  ulong in_R9;
  Optional<Corrade::Utility::Json> OVar3;
  StringView filename_00;
  StringView value;
  Optional<Corrade::Containers::String> string;
  Optional<Corrade::Containers::String> local_78;
  Error local_58;
  BasicStringView<const_char> local_30;
  undefined8 uVar2;
  
  filename_00._data = (char *)filename._sizePlusFlags;
  filename_00._sizePlusFlags = in_RDX;
  Path::readString(&local_78,filename_00);
  if (local_78._set == false) {
    Error::Error(&local_58,(Flags)0x0);
    this = Debug::operator<<(&local_58.super_Debug,"Utility::Json::fromFile(): can\'t read");
    value._sizePlusFlags = in_RDX;
    value._data = filename_00._data;
    Debug::operator<<(this,value);
    Error::~Error(&local_58);
    *(char *)((long)filename._data + 8) = '\0';
    uVar2 = extraout_RDX;
  }
  else {
    string_00 = Containers::Optional<Corrade::Containers::String>::operator*(&local_78);
    Containers::BasicStringView<const_char>::BasicStringView(&local_30,string_00);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_R9;
    OVar3 = tokenize(filename,in_RDX,0,(StringView)(auVar1 << 0x40));
    uVar2 = OVar3._8_8_;
  }
  if (local_78._set == true) {
    Containers::String::~String((String *)&local_78);
    uVar2 = extraout_RDX_00;
  }
  OVar3._8_8_ = uVar2;
  OVar3.field_0 = (anon_union_8_1_49ece5b0_for_Optional<Corrade::Utility::Json>_1)filename._data;
  return OVar3;
}

Assistant:

Containers::Optional<Json> Json::fromFile(const Containers::StringView filename) {
    Containers::Optional<Containers::String> string = Path::readString(filename);
    if(!string) {
        Error{} << "Utility::Json::fromFile(): can't read" << filename;
        return {};
    }

    return tokenize(filename, 0, 0, *string);
}